

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

Instrument * __thiscall
SFFile::LoadInstrumentOrder(SFFile *this,Renderer *song,int order,int drum,int bank,int program)

{
  SFPerc *perc;
  SFPreset *preset;
  Instrument *pIVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  if (drum == 0) {
    preset = this->Presets;
    iVar2 = 1;
    if (1 < this->NumPresets) {
      iVar2 = this->NumPresets;
    }
    uVar3 = (ulong)(iVar2 - 1);
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      if ((((order < 0) || (((byte)preset->field_0x15 & 0x7f) == order)) &&
          ((uint)preset->Bank == bank)) && ((uint)preset->Program == program)) {
        pIVar1 = LoadPreset(this,song,preset);
        return pIVar1;
      }
      preset = preset + 1;
    }
  }
  else {
    uVar3 = (ulong)(this->Percussion).Count;
    perc = (this->Percussion).Array;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      if (((order < 0) || ((uint)perc->LoadOrder == order)) &&
         (((uint)(perc->Generators).field_0.keyRange.Lo == bank &&
          ((uint)(perc->Generators).field_0.keyRange.Hi == program)))) {
        pIVar1 = LoadPercussion(this,song,perc);
        return pIVar1;
      }
      perc = perc + 1;
    }
  }
  return (Instrument *)0x0;
}

Assistant:

Instrument *SFFile::LoadInstrumentOrder(Renderer *song, int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (unsigned int i = 0; i < Percussion.Size(); ++i)
		{
			if ((order < 0 || Percussion[i].LoadOrder == order) &&
				Percussion[i].Generators.drumset == bank &&
				Percussion[i].Generators.key == program)
			{
				return LoadPercussion(song, &Percussion[i]);
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets - 1; ++i)
		{
			if ((order < 0 || Presets[i].LoadOrder == order) &&
				Presets[i].Bank == bank &&
				Presets[i].Program == program)
			{
				return LoadPreset(song, &Presets[i]);
			}
		}
	}
	return NULL;
}